

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void Curl_conncache_foreach(conncache *connc,void *param,_func_int_connectdata_ptr_void_ptr *func)

{
  long lVar1;
  void **ppvVar2;
  int iVar3;
  connectdata *conn;
  connectbundle *bundle;
  curl_hash_element *he;
  curl_llist_element *curr;
  curl_hash_iterator iter;
  _func_int_connectdata_ptr_void_ptr *func_local;
  void *param_local;
  conncache *connc_local;
  
  if (connc != (conncache *)0x0) {
    iter.current_element = (curl_llist_element *)func;
    Curl_hash_start_iterate(&connc->hash,(curl_hash_iterator *)&curr);
    bundle = (connectbundle *)Curl_hash_next_element((curl_hash_iterator *)&curr);
    while (bundle != (connectbundle *)0x0) {
      lVar1 = *(long *)bundle;
      bundle = (connectbundle *)Curl_hash_next_element((curl_hash_iterator *)&curr);
      he = (curl_hash_element *)**(undefined8 **)(lVar1 + 0x10);
      while (he != (curl_hash_element *)0x0) {
        ppvVar2 = &he->ptr;
        he = (curl_hash_element *)he->key_len;
        iVar3 = (*(code *)iter.current_element)(*ppvVar2,param);
        if (iVar3 == 1) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void Curl_conncache_foreach(struct conncache *connc,
                            void *param,
                            int (*func)(struct connectdata *conn, void *param))
{
  struct curl_hash_iterator iter;
  struct curl_llist_element *curr;
  struct curl_hash_element *he;

  if(!connc)
    return;

  Curl_hash_start_iterate(&connc->hash, &iter);

  he = Curl_hash_next_element(&iter);
  while(he) {
    struct connectbundle *bundle;

    bundle = he->ptr;
    he = Curl_hash_next_element(&iter);

    curr = bundle->conn_list->head;
    while(curr) {
      /* Yes, we need to update curr before calling func(), because func()
         might decide to remove the connection */
      struct connectdata *conn = curr->ptr;
      curr = curr->next;

      if(1 == func(conn, param))
        return;
    }
  }
}